

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_tmpfile.h
# Opt level: O0

int fio_tmpfile(void)

{
  int iVar1;
  char local_38 [8];
  char name_template [31];
  int fd;
  
  builtin_strncpy(local_38,"/tmp/fac",8);
  builtin_strncpy(name_template,"il_io_tmpfile_XXXXXXXX",0x17);
  iVar1 = mkstemp(local_38);
  return iVar1;
}

Assistant:

static inline int fio_tmpfile(void) {
  // create a temporary file to contain the data.
  int fd = 0;
#ifdef P_tmpdir
  if (P_tmpdir[sizeof(P_tmpdir) - 1] == '/') {
    char name_template[] = P_tmpdir "facil_io_tmpfile_XXXXXXXX";
    fd = mkstemp(name_template);
  } else {
    char name_template[] = P_tmpdir "/facil_io_tmpfile_XXXXXXXX";
    fd = mkstemp(name_template);
  }
#else
  char name_template[] = "/tmp/facil_io_tmpfile_XXXXXXXX";
  fd = mkstemp(name_template);
#endif
  return fd;
}